

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdm.cpp
# Opt level: O2

void __thiscall insyde_fdm_t::_read(insyde_fdm_t *this)

{
  fdm_extensions_t *pfVar1;
  fdm_board_ids_t *pfVar2;
  fdm_entries_t *pfVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  kstream *pkVar7;
  fdm_extensions_t *this_00;
  reference pvVar8;
  fdm_board_ids_t *this_01;
  fdm_entries_t *this_02;
  pointer __p;
  string local_38;
  
  uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_signature = uVar5;
  uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_store_size = uVar5;
  uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_data_offset = uVar5;
  uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_entry_size = uVar5;
  uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_entry_format = uVar4;
  uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_revision = uVar4;
  uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_num_extensions = uVar4;
  uVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_checksum = uVar4;
  uVar6 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_fd_base_address = uVar6;
  this->n_extensions = true;
  if (this->m_revision < 3) {
    this->n_board_ids = true;
  }
  else {
    this->n_extensions = false;
    kaitai::kstream::read_bytes_abi_cxx11_
              (&local_38,(this->super_kstruct).m__io,(ulong)this->m_num_extensions << 2);
    std::__cxx11::string::operator=((string *)&this->m__raw_extensions,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    pkVar7 = (kstream *)operator_new(0x198);
    kaitai::kstream::kstream(pkVar7,&this->m__raw_extensions);
    local_38._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::reset
              ((__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)
               &this->m__io__raw_extensions,pkVar7);
    std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
              ((unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)&local_38);
    this_00 = (fdm_extensions_t *)operator_new(0x28);
    fdm_extensions_t::fdm_extensions_t
              (this_00,(this->m__io__raw_extensions)._M_t.
                       super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>
                       .super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl,this,
               this->m__root);
    pfVar1 = (this->m_extensions)._M_t.
             super___uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
             .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl;
    (this->m_extensions)._M_t.
    super___uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
    .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl = this_00;
    if (pfVar1 != (fdm_extensions_t *)0x0) {
      (**(code **)((long)(pfVar1->super_kstruct)._vptr_kstruct + 8))();
    }
    this->n_board_ids = true;
    if (2 < this->m_revision) {
      pvVar8 = std::
               vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
               ::at((vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
                     *)(((this->m_extensions)._M_t.
                         super___uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
                         .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>.
                        _M_head_impl)->m_extensions)._M_t.
                       super___uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
                    ,1);
      if (((pvVar8->_M_t).
           super___uniq_ptr_impl<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extension_t_*,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>
           .super__Head_base<0UL,_insyde_fdm_t::fdm_extension_t_*,_false>._M_head_impl)->m_count !=
          0) {
        this->n_board_ids = false;
        this_01 = (fdm_board_ids_t *)operator_new(0x30);
        fdm_board_ids_t::fdm_board_ids_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
        pfVar2 = (this->m_board_ids)._M_t.
                 super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                 .super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>._M_head_impl;
        (this->m_board_ids)._M_t.
        super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
        ._M_t.
        super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
        .super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>._M_head_impl = this_01;
        if (pfVar2 != (fdm_board_ids_t *)0x0) {
          (**(code **)((long)(pfVar2->super_kstruct)._vptr_kstruct + 8))();
        }
      }
    }
  }
  kaitai::kstream::read_bytes_abi_cxx11_
            (&local_38,(this->super_kstruct).m__io,(ulong)(this->m_store_size - this->m_data_offset)
            );
  std::__cxx11::string::operator=((string *)&this->m__raw_entries,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pkVar7 = (kstream *)operator_new(0x198);
  kaitai::kstream::kstream(pkVar7,&this->m__raw_entries);
  local_38._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::reset
            ((__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)
             &this->m__io__raw_entries,pkVar7);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
            ((unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)&local_38);
  this_02 = (fdm_entries_t *)operator_new(0x28);
  fdm_entries_t::fdm_entries_t
            (this_02,(this->m__io__raw_entries)._M_t.
                     super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>
                     .super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl,this,
             this->m__root);
  pfVar3 = (this->m_entries)._M_t.
           super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
           .super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>._M_head_impl;
  (this->m_entries)._M_t.
  super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
  .super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>._M_head_impl = this_02;
  if (pfVar3 != (fdm_entries_t *)0x0) {
    (**(code **)((long)(pfVar3->super_kstruct)._vptr_kstruct + 8))();
  }
  return;
}

Assistant:

void insyde_fdm_t::_read() {
    m_signature = m__io->read_u4le();
    m_store_size = m__io->read_u4le();
    m_data_offset = m__io->read_u4le();
    m_entry_size = m__io->read_u4le();
    m_entry_format = m__io->read_u1();
    m_revision = m__io->read_u1();
    m_num_extensions = m__io->read_u1();
    m_checksum = m__io->read_u1();
    m_fd_base_address = m__io->read_u8le();
    n_extensions = true;
    if (revision() > 2) {
        n_extensions = false;
        m__raw_extensions = m__io->read_bytes((num_extensions() * 4));
        m__io__raw_extensions = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_extensions));
        m_extensions = std::unique_ptr<fdm_extensions_t>(new fdm_extensions_t(m__io__raw_extensions.get(), this, m__root));
    }
    n_board_ids = true;
    if ( ((revision() > 2) && (extensions()->extensions()->at(1)->count() > 0)) ) {
        n_board_ids = false;
        m_board_ids = std::unique_ptr<fdm_board_ids_t>(new fdm_board_ids_t(m__io, this, m__root));
    }
    m__raw_entries = m__io->read_bytes((store_size() - data_offset()));
    m__io__raw_entries = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_entries));
    m_entries = std::unique_ptr<fdm_entries_t>(new fdm_entries_t(m__io__raw_entries.get(), this, m__root));
}